

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O3

void hbtrie_reverse_iterator_test(void)

{
  char cVar1;
  hbtrie_result hVar2;
  int iVar3;
  filemgr_ops *ops;
  btree_blk_ops *btree_blk_ops;
  size_t sVar4;
  char *__s;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  uint64_t uVar8;
  filemgr_open_result fVar9;
  uint64_t v;
  size_t keylen;
  int local_43c;
  filemgr *local_438;
  btreeblk_handle bhandle;
  hbtrie_iterator hit;
  uint64_t v_out;
  hbtrie trie;
  timeval __test_begin;
  char key [256];
  char key_temp [256];
  filemgr_config config;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  memleak_start();
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.blocksize = 0x100;
  config.ncacheblock = 0;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.flag = 0;
  config.chunksize = 8;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  ops = get_filemgr_ops();
  fVar9 = filemgr_open("./hbtrie_testfile",ops,&config,(err_log_callback *)0x0);
  local_438 = fVar9.file;
  btreeblk_init(&bhandle,local_438,0x100);
  btree_blk_ops = btreeblk_get_ops();
  hbtrie_init(&trie,8,8,0x100,0xffffffffffffffff,&bhandle,btree_blk_ops,(void *)0x0,
              _readkey_wrap_memory_itr);
  uVar8 = 0;
  uVar7 = 0;
  do {
    v = uVar8;
    sprintf(key,"key%06d",uVar7 & 0xffffffff);
    sVar4 = strlen(key);
    hbtrie_insert(&trie,key,(int)sVar4,&v,&v_out);
    btreeblk_end(&bhandle);
    uVar7 = uVar7 + 1;
    uVar8 = uVar8 + 0x100000000000000;
  } while (uVar7 != 0x1e);
  hbtrie_iterator_init(&trie,&hit,(void *)0x0,0);
  pcVar6 = key;
  hVar2 = hbtrie_next(&hit,pcVar6,&keylen,&v);
  if (hVar2 != HBTRIE_RESULT_SUCCESS) goto LAB_00107a0c;
  uVar7 = 0;
  do {
    btreeblk_end(&bhandle);
    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
        (v & 0xff00) << 0x28 | v << 0x38;
    sprintf(key_temp,"key%06d",uVar7 & 0xffffffff);
    iVar3 = bcmp(key,key_temp,keylen);
    if (iVar3 != 0) {
      hbtrie_reverse_iterator_test();
    }
    if (uVar7 != v) {
      hbtrie_reverse_iterator_test();
    }
    uVar7 = uVar7 + 1;
    pcVar6 = key;
    hVar2 = hbtrie_next(&hit,key,&keylen,&v);
  } while (hVar2 == HBTRIE_RESULT_SUCCESS);
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
  if (uVar7 != 0x1e) goto LAB_00107a23;
  hbtrie_iterator_init(&trie,&hit,(void *)0x0,0);
  hVar2 = hbtrie_prev(&hit,key,&keylen,&v);
  btreeblk_end(&bhandle);
  if (hVar2 == HBTRIE_RESULT_SUCCESS) {
    local_43c = 0;
    do {
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      hVar2 = hbtrie_prev(&hit,key,&keylen,&v);
      btreeblk_end(&bhandle);
    } while (hVar2 == HBTRIE_RESULT_SUCCESS);
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    if (local_43c == 0) {
      hbtrie_reverse_iterator_test();
      goto LAB_001074a2;
    }
  }
  else {
LAB_001074a2:
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
  }
  pcVar6 = key;
  sprintf(pcVar6,"key%06d",0x3c);
  sVar4 = strlen(pcVar6);
  hbtrie_iterator_init(&trie,&hit,pcVar6,sVar4);
  hVar2 = hbtrie_prev(&hit,pcVar6,&keylen,&v);
  btreeblk_end(&bhandle);
  if (hVar2 != HBTRIE_RESULT_SUCCESS) goto LAB_00107a28;
  uVar7 = 0x1d;
  do {
    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
        (v & 0xff00) << 0x28 | v << 0x38;
    sprintf(key_temp,"key%06d",uVar7 & 0xffffffff);
    iVar3 = bcmp(key,key_temp,keylen);
    if (iVar3 != 0) {
      hbtrie_reverse_iterator_test();
    }
    if (uVar7 != v) {
      hbtrie_reverse_iterator_test();
    }
    pcVar6 = key;
    hVar2 = hbtrie_prev(&hit,key,&keylen,&v);
    btreeblk_end(&bhandle);
    uVar7 = uVar7 - 1;
  } while (hVar2 == HBTRIE_RESULT_SUCCESS);
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
  if (uVar7 != 0xffffffffffffffff) goto LAB_00107a3f;
  pcVar6 = key;
  sprintf(pcVar6,"key%06dxx",0xf);
  sVar4 = strlen(pcVar6);
  hbtrie_iterator_init(&trie,&hit,pcVar6,sVar4);
  hVar2 = hbtrie_prev(&hit,pcVar6,&keylen,&v);
  btreeblk_end(&bhandle);
  if (hVar2 != HBTRIE_RESULT_SUCCESS) goto LAB_00107a44;
  uVar7 = 0xf;
  do {
    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
        (v & 0xff00) << 0x28 | v << 0x38;
    sprintf(key_temp,"key%06d",uVar7 & 0xffffffff);
    iVar3 = bcmp(key,key_temp,keylen);
    if (iVar3 != 0) {
      hbtrie_reverse_iterator_test();
    }
    if (uVar7 != v) {
      hbtrie_reverse_iterator_test();
    }
    pcVar6 = key;
    hVar2 = hbtrie_prev(&hit,key,&keylen,&v);
    btreeblk_end(&bhandle);
    uVar7 = uVar7 - 1;
  } while (hVar2 == HBTRIE_RESULT_SUCCESS);
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
  if (uVar7 == 0xffffffffffffffff) {
    hbtrie_iterator_init(&trie,&hit,(void *)0x0,0);
    uVar7 = 0;
    do {
      pcVar6 = key;
      hVar2 = hbtrie_next(&hit,key,&keylen,&v);
      if (hVar2 == HBTRIE_RESULT_FAIL) {
        hbtrie_reverse_iterator_test();
        goto LAB_00107a02;
      }
      btreeblk_end(&bhandle);
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      sprintf(key_temp,"key%06d",uVar7 & 0xffffffff);
      iVar3 = bcmp(key,key_temp,keylen);
      if (iVar3 != 0) {
        hbtrie_reverse_iterator_test();
      }
      if (uVar7 != v) {
        hbtrie_reverse_iterator_test();
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x15);
    uVar7 = 0x13;
    do {
      pcVar6 = key;
      hVar2 = hbtrie_prev(&hit,key,&keylen,&v);
      if (hVar2 == HBTRIE_RESULT_FAIL) goto LAB_00107a02;
      btreeblk_end(&bhandle);
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      sprintf(key_temp,"key%06d",uVar7 & 0xffffffff);
      iVar3 = bcmp(key,key_temp,keylen);
      if (iVar3 != 0) {
        hbtrie_reverse_iterator_test();
      }
      if (uVar7 != v) {
        hbtrie_reverse_iterator_test();
      }
      uVar7 = uVar7 - 1;
    } while (uVar7 != 9);
    uVar7 = 0xb;
    do {
      pcVar6 = key;
      hVar2 = hbtrie_next(&hit,key,&keylen,&v);
      if (hVar2 == HBTRIE_RESULT_FAIL) goto LAB_00107a07;
      btreeblk_end(&bhandle);
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      sprintf(key_temp,"key%06d",uVar7 & 0xffffffff);
      iVar3 = bcmp(key,key_temp,keylen);
      if (iVar3 != 0) {
        hbtrie_reverse_iterator_test();
      }
      if (uVar7 != v) {
        hbtrie_reverse_iterator_test();
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x1e);
    pcVar6 = key;
    hVar2 = hbtrie_next(&hit,pcVar6,&keylen,&v);
    btreeblk_end(&bhandle);
    if (hVar2 == HBTRIE_RESULT_FAIL) {
      hbtrie_iterator_free(&hit);
      hbtrie_free(&trie);
      btreeblk_free(&bhandle);
      filemgr_close(local_438,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (hbtrie_reverse_iterator_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"HB+trie reverse iterator test");
      return;
    }
    goto LAB_00107a60;
  }
  goto LAB_00107a5b;
LAB_00107a02:
  hbtrie_reverse_iterator_test();
LAB_00107a07:
  hbtrie_reverse_iterator_test();
LAB_00107a0c:
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
LAB_00107a23:
  hbtrie_reverse_iterator_test();
LAB_00107a28:
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
LAB_00107a3f:
  hbtrie_reverse_iterator_test();
LAB_00107a44:
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
LAB_00107a5b:
  hbtrie_reverse_iterator_test();
LAB_00107a60:
  hbtrie_reverse_iterator_test();
  uVar7 = ((ulong)pcVar6 >> 0x38 | ((ulong)pcVar6 & 0xff000000000000) >> 0x28 |
           ((ulong)pcVar6 & 0xff0000000000) >> 0x18 | ((ulong)pcVar6 & 0xff00000000) >> 8 |
           ((ulong)pcVar6 & 0xff000000) << 8 | ((ulong)pcVar6 & 0xff0000) << 0x18 |
           ((ulong)pcVar6 & 0xff00) << 0x28 | (long)pcVar6 << 0x38) % 100;
  __s[0] = '\0';
  __s[1] = '\0';
  __s[2] = '\0';
  __s[3] = '\0';
  __s[4] = '\0';
  __s[5] = '\0';
  __s[6] = '\0';
  __s[7] = '\0';
  __s[8] = '\0';
  __s[9] = '\0';
  __s[10] = '\0';
  __s[0xb] = '\0';
  __s[0xc] = '\0';
  __s[0xd] = '\0';
  __s[0xe] = '\0';
  __s[0xf] = '\0';
  uVar5 = (uint)uVar7;
  cVar1 = (char)(uVar5 * 0x56 >> 8);
  sprintf(__s,"key%05d%08d%08d",(ulong)(uVar5 / 9),
          (ulong)(byte)(cVar1 + (char)((uVar5 / 3) * 0x56 >> 8) * -3),
          (ulong)(byte)((char)uVar7 + cVar1 * -3));
  strlen(__s);
  return;
}

Assistant:

void hbtrie_reverse_iterator_test()
{
    TEST_INIT();

    int ksize = 8, vsize = 8, r, n=30, c;
    int nodesize = 256;
    uint64_t i, v, v_out;
    char key[256], key_temp[256];
    size_t keylen;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct hbtrie trie;
    struct hbtrie_iterator hit;
    struct filemgr_config config;
    hbtrie_result hr;
    filemgr_open_result fr;
    char *fname = (char *) "./hbtrie_testfile";

    r = system(SHELL_DEL" hbtrie_testfile");
    (void)r;
    memleak_start();

    memset(&config, 0, sizeof(config));
    config.blocksize = nodesize;
    config.options = FILEMGR_CREATE;
    config.chunksize = ksize;
    config.num_wal_shards = 8;

    fr = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = fr.file;

    btreeblk_init(&bhandle, file, nodesize);
    hbtrie_init(&trie, ksize, vsize, nodesize, BLK_NOT_FOUND,
        &bhandle, btreeblk_get_ops(), NULL, _readkey_wrap_memory_itr);

    for (i=0;i<(uint64_t)n;++i){
        v = _endian_encode(i);
        sprintf(key, HB_KEYSTR, (int)i);
        hbtrie_insert(&trie, key, strlen(key), &v, &v_out);
        btreeblk_end(&bhandle);
    }

    c = 0;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    while( (hr=hbtrie_next(&hit, key, &keylen, &v)) == HBTRIE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == n);

    c = 0;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == 0);

    c = 0;
    sprintf(key, HB_KEYSTR, (int)n*2);
    hbtrie_iterator_init(&trie, &hit, key, strlen(key));
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)(n-c-1));
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)n-c-1);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == n);

    c = 0;
    sprintf(key, HB_KEYSTR"xx", (int)n/2);
    hbtrie_iterator_init(&trie, &hit, key, strlen(key));
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)((n/2)-c));
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)(n/2)-c);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == (n/2)+1);

    c = -1;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    for (i=0;i<21;++i){
        c++;
        hr=hbtrie_next(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    for (i=0;i<10;++i){
        c--;
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    for (i=0;i<19;++i){
        c++;
        hr=hbtrie_next(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    hr=hbtrie_next(&hit, key, &keylen, &v);
    btreeblk_end(&bhandle);
    TEST_CHK(hr == HBTRIE_RESULT_FAIL);
    hbtrie_iterator_free(&hit);

    hbtrie_free(&trie);
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    memleak_end();

    TEST_RESULT("HB+trie reverse iterator test");
}